

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-linux.c
# Opt level: O3

FUNCTION_RETURN getModuleName(char *buffer)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  FUNCTION_RETURN FVar5;
  char pidStr [64];
  char proc_path [4096];
  char path [4096];
  char acStack_2068 [64];
  char local_2028 [4096];
  char local_1028 [4104];
  
  memset(local_1028,0,0x1000);
  uVar1 = getpid();
  sprintf(acStack_2068,"%d",(ulong)uVar1);
  builtin_strncpy(local_2028,"/proc/",7);
  strcat(local_2028,acStack_2068);
  sVar3 = strlen(local_2028);
  builtin_strncpy(local_2028 + sVar3,"/exe",5);
  sVar4 = readlink(local_2028,local_1028,0xfff);
  FVar5 = FUNC_RET_ERROR;
  iVar2 = (int)sVar4;
  if (iVar2 != -1) {
    local_1028[iVar2] = '\0';
    strncpy(buffer,local_1028,(long)iVar2);
    FVar5 = FUNC_RET_OK;
  }
  return FVar5;
}

Assistant:

FUNCTION_RETURN getModuleName(char buffer[MAX_PATH]) {
	FUNCTION_RETURN result;
	char path[MAX_PATH] = { 0 };
	char proc_path[MAX_PATH], pidStr[64];
	pid_t pid = getpid();
	sprintf(pidStr, "%d", pid);
	strcpy(proc_path, "/proc/");
	strcat(proc_path, pidStr);
	strcat(proc_path, "/exe");

	int ch = readlink(proc_path, path, MAX_PATH-1);
	if (ch != -1) {
		path[ch] = '\0';
		strncpy(buffer, path, ch);
		result = FUNC_RET_OK;
	} else {
		result = FUNC_RET_ERROR;
	}
	return result;
}